

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Object * __thiscall json::Object::add<json::Object,json::Object>(Object *this,string *key,Object *v)

{
  byte bVar1;
  Object *this_00;
  runtime_error *this_01;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Object_*>_>::value,_pair<iterator,_bool>_>
  _Var2;
  Object *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::Object_*>
  local_58;
  _Base_ptr local_30;
  byte local_28;
  Object *local_20;
  Object *v_local;
  string *key_local;
  Object *this_local;
  
  local_20 = v;
  v_local = (Object *)key;
  key_local = (string *)this;
  this_00 = (Object *)operator_new(0x38);
  Object(this_00,local_20);
  local_60 = this_00;
  std::make_pair<std::__cxx11::string_const&,json::Object*>(&local_58,key,&local_60);
  _Var2 = std::
          map<std::__cxx11::string,common::XPtr<json::Type>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
          ::insert<std::pair<std::__cxx11::string,json::Object*>>
                    ((map<std::__cxx11::string,common::XPtr<json::Type>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
                      *)&this->fields,&local_58);
  local_30 = (_Base_ptr)_Var2.first._M_node;
  local_28 = _Var2.second;
  bVar1 = local_28 ^ 0xff;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::Object_*>
  ::~pair(&local_58);
  if ((bVar1 & 1) == 0) {
    return this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"can\'t insert field");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object& add(std::string const& key, V const& v) {
            json_assert(fields.insert(std::make_pair(key, new T(v))).second, "can't insert field");
            return *this;
        }